

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qownlanguagedata.cpp
# Opt level: O1

void initSQLData(void)

{
  QMultiHash<char,_QLatin1String> QVar1;
  QMultiHash<char,_QLatin1String> QVar2;
  QMultiHash<char,_QLatin1String> QVar3;
  Data<QHashPrivate::MultiNode<char,_QLatin1String>_> *pDVar4;
  long lVar5;
  QMultiHash<char,_QLatin1String> moved;
  char local_1d39;
  QMultiHash<char,_QLatin1String> local_1d38;
  iterator local_1d28;
  undefined1 local_1d10 [16];
  char *local_1d00;
  undefined1 local_1cf8;
  undefined8 local_1cf0;
  char *local_1ce8;
  undefined1 local_1ce0;
  undefined8 local_1cd8;
  char *local_1cd0;
  undefined1 local_1cc8;
  undefined8 local_1cc0;
  char *local_1cb8;
  undefined1 local_1cb0;
  undefined8 local_1ca8;
  char *local_1ca0;
  undefined1 local_1c98;
  undefined8 local_1c90;
  char *local_1c88;
  undefined1 local_1c80;
  undefined8 local_1c78;
  char *local_1c70;
  undefined1 local_1c68;
  undefined8 local_1c60;
  char *local_1c58;
  undefined1 local_1c50;
  undefined8 local_1c48;
  char *local_1c40;
  undefined1 local_1c38;
  undefined8 local_1c30;
  char *local_1c28;
  undefined1 local_1c20;
  undefined8 local_1c18;
  char *local_1c10;
  undefined1 local_1c08;
  undefined8 local_1c00;
  char *local_1bf8;
  undefined1 local_1bf0;
  undefined8 local_1be8;
  char *local_1be0;
  undefined1 local_1bd8;
  undefined8 local_1bd0;
  char *local_1bc8;
  undefined1 local_1bc0;
  undefined8 local_1bb8;
  char *local_1bb0;
  undefined1 local_1ba8;
  undefined8 local_1ba0;
  char *local_1b98;
  undefined1 local_1b90;
  undefined8 local_1b88;
  char *local_1b80;
  undefined1 local_1b78;
  undefined8 local_1b70;
  char *local_1b68;
  undefined1 local_1b60;
  undefined8 local_1b58;
  char *local_1b50;
  undefined1 local_1b48;
  undefined8 local_1b40;
  char *local_1b38;
  undefined1 local_1b30;
  undefined8 local_1b28;
  char *local_1b20;
  undefined1 local_1b18;
  undefined8 local_1b10;
  char *local_1b08;
  undefined1 local_1b00;
  undefined8 local_1af8;
  char *local_1af0;
  undefined1 local_1ae8;
  undefined8 local_1ae0;
  char *local_1ad8;
  undefined1 local_1ad0;
  undefined8 local_1ac8;
  char *local_1ac0;
  undefined1 local_1ab8;
  undefined8 local_1ab0;
  char *local_1aa8;
  undefined1 local_1aa0;
  undefined8 local_1a98;
  char *local_1a90;
  undefined1 local_1a88;
  undefined8 local_1a80;
  char *local_1a78;
  undefined1 local_1a70;
  undefined8 local_1a68;
  char *local_1a60;
  undefined1 local_1a58;
  undefined8 local_1a50;
  char *local_1a48;
  undefined1 local_1a40;
  undefined8 local_1a38;
  char *local_1a30;
  undefined1 local_1a28;
  undefined8 local_1a20;
  char *local_1a18;
  undefined1 local_1a10;
  undefined8 local_1a08;
  char *local_1a00;
  undefined1 local_19f8;
  undefined8 local_19f0;
  char *local_19e8;
  undefined1 local_19e0;
  undefined8 local_19d8;
  char *local_19d0;
  undefined1 local_19c8;
  undefined8 local_19c0;
  char *local_19b8;
  undefined1 local_19b0;
  undefined8 local_19a8;
  char *local_19a0;
  undefined1 local_1998;
  undefined8 local_1990;
  char *local_1988;
  undefined1 local_1980;
  undefined8 local_1978;
  char *local_1970;
  undefined1 local_1968;
  undefined8 local_1960;
  char *local_1958;
  undefined1 local_1950;
  undefined8 local_1948;
  char *local_1940;
  undefined1 local_1938;
  undefined8 local_1930;
  char *local_1928;
  undefined1 local_1920;
  undefined8 local_1918;
  char *local_1910;
  undefined1 local_1908;
  undefined8 local_1900;
  char *local_18f8;
  undefined1 local_18f0;
  undefined8 local_18e8;
  char *local_18e0;
  undefined1 local_18d8;
  undefined8 local_18d0;
  char *local_18c8;
  undefined1 local_18c0;
  undefined8 local_18b8;
  char *local_18b0;
  undefined1 local_18a8;
  undefined8 local_18a0;
  char *local_1898;
  undefined1 local_1890;
  undefined8 local_1888;
  char *local_1880;
  undefined1 local_1878;
  undefined8 local_1870;
  char *local_1868;
  undefined1 local_1860;
  undefined8 local_1858;
  char *local_1850;
  undefined1 local_1848;
  undefined8 local_1840;
  char *local_1838;
  undefined1 local_1830;
  undefined8 local_1828;
  char *local_1820;
  undefined1 local_1818;
  undefined8 local_1810;
  char *local_1808;
  undefined1 local_1800;
  undefined8 local_17f8;
  char *local_17f0;
  undefined1 local_17e8;
  undefined8 local_17e0;
  char *local_17d8;
  undefined1 local_17d0;
  undefined8 local_17c8;
  char *local_17c0;
  undefined1 local_17b8;
  undefined8 local_17b0;
  char *local_17a8;
  undefined1 local_17a0;
  undefined8 local_1798;
  char *local_1790;
  undefined1 local_1788;
  undefined8 local_1780;
  char *local_1778;
  undefined1 local_1770;
  undefined8 local_1768;
  char *local_1760;
  undefined1 local_1758;
  undefined8 local_1750;
  char *local_1748;
  undefined1 local_1740;
  undefined8 local_1738;
  char *local_1730;
  undefined1 local_1728;
  undefined8 local_1720;
  char *local_1718;
  undefined1 local_1710;
  undefined8 local_1708;
  char *local_1700;
  undefined1 local_16f8;
  undefined8 local_16f0;
  char *local_16e8;
  undefined1 local_16e0;
  undefined8 local_16d8;
  char *local_16d0;
  undefined1 local_16c8;
  undefined8 local_16c0;
  char *local_16b8;
  undefined1 local_16b0;
  undefined8 local_16a8;
  char *local_16a0;
  undefined1 local_1698;
  undefined8 local_1690;
  char *local_1688;
  undefined1 local_1680;
  undefined8 local_1678;
  char *local_1670;
  undefined1 local_1668;
  undefined8 local_1660;
  char *local_1658;
  undefined1 local_1650;
  undefined8 local_1648;
  char *local_1640;
  undefined1 local_1638;
  undefined8 local_1630;
  char *local_1628;
  undefined1 local_1620;
  undefined8 local_1618;
  char *local_1610;
  undefined1 local_1608;
  undefined8 local_1600;
  char *local_15f8;
  undefined1 local_15f0;
  undefined8 local_15e8;
  char *local_15e0;
  undefined1 local_15d8;
  undefined8 local_15d0;
  char *local_15c8;
  undefined1 local_15c0;
  undefined8 local_15b8;
  char *local_15b0;
  undefined1 local_15a8;
  undefined8 local_15a0;
  char *local_1598;
  undefined1 local_1590;
  undefined8 local_1588;
  char *local_1580;
  undefined1 local_1578;
  undefined8 local_1570;
  char *local_1568;
  undefined1 local_1560;
  undefined8 local_1558;
  char *local_1550;
  undefined1 local_1548;
  undefined8 local_1540;
  char *local_1538;
  undefined1 local_1530;
  undefined8 local_1528;
  char *local_1520;
  undefined1 local_1518;
  undefined8 local_1510;
  char *local_1508;
  undefined1 local_1500;
  undefined8 local_14f8;
  char *local_14f0;
  undefined1 local_14e8;
  undefined8 local_14e0;
  char *local_14d8;
  undefined1 local_14d0;
  undefined8 local_14c8;
  char *local_14c0;
  undefined1 local_14b8;
  undefined8 local_14b0;
  char *local_14a8;
  undefined1 local_14a0;
  undefined8 local_1498;
  char *local_1490;
  undefined1 local_1488;
  undefined8 local_1480;
  char *local_1478;
  undefined1 local_1470;
  undefined8 local_1468;
  char *local_1460;
  undefined1 local_1458;
  undefined8 local_1450;
  char *local_1448;
  undefined1 local_1440;
  undefined8 local_1438;
  char *local_1430;
  undefined1 local_1428;
  undefined8 local_1420;
  char *local_1418;
  undefined1 local_1410;
  undefined8 local_1408;
  char *local_1400;
  undefined1 local_13f8;
  undefined8 local_13f0;
  char *local_13e8;
  undefined1 local_13e0;
  undefined8 local_13d8;
  char *local_13d0;
  undefined1 local_13c8;
  undefined8 local_13c0;
  char *local_13b8;
  undefined1 local_13b0;
  undefined8 local_13a8;
  char *local_13a0;
  undefined1 local_1398;
  undefined8 local_1390;
  char *local_1388;
  undefined1 local_1380;
  undefined8 local_1378;
  char *local_1370;
  undefined1 local_1368;
  undefined8 local_1360;
  char *local_1358;
  undefined1 local_1350;
  undefined8 local_1348;
  char *local_1340;
  undefined1 local_1338;
  undefined8 local_1330;
  char *local_1328;
  undefined1 local_1320;
  undefined8 local_1318;
  char *local_1310;
  undefined1 local_1308;
  undefined8 local_1300;
  char *local_12f8;
  undefined1 local_12f0;
  undefined8 local_12e8;
  char *local_12e0;
  undefined1 local_12d8;
  undefined8 local_12d0;
  char *local_12c8;
  undefined1 local_12c0;
  undefined8 local_12b8;
  char *local_12b0;
  undefined1 local_12a8;
  undefined8 local_12a0;
  char *local_1298;
  undefined1 local_1290;
  undefined8 local_1288;
  char *local_1280;
  undefined1 local_1278;
  undefined8 local_1270;
  char *local_1268;
  undefined1 local_1260;
  undefined8 local_1258;
  char *local_1250;
  undefined1 local_1248;
  undefined8 local_1240;
  char *local_1238;
  undefined1 local_1230;
  undefined8 local_1228;
  char *local_1220;
  undefined1 local_1218;
  undefined8 local_1210;
  char *local_1208;
  undefined1 local_1200;
  undefined8 local_11f8;
  char *local_11f0;
  undefined1 local_11e8;
  undefined8 local_11e0;
  char *local_11d8;
  undefined1 local_11d0;
  undefined8 local_11c8;
  char *local_11c0;
  undefined1 local_11b8;
  undefined8 local_11b0;
  char *local_11a8;
  undefined1 local_11a0;
  undefined8 local_1198;
  char *local_1190;
  undefined1 local_1188;
  undefined8 local_1180;
  char *local_1178;
  undefined1 local_1170;
  undefined8 local_1168;
  char *local_1160;
  undefined1 local_1158;
  undefined8 local_1150;
  char *local_1148;
  undefined1 local_1140;
  undefined8 local_1138;
  char *local_1130;
  undefined1 local_1128;
  undefined8 local_1120;
  char *local_1118;
  undefined1 local_1110;
  undefined8 local_1108;
  char *local_1100;
  undefined1 local_10f8;
  undefined8 local_10f0;
  char *local_10e8;
  undefined1 local_10e0;
  undefined8 local_10d8;
  char *local_10d0;
  undefined1 local_10c8;
  undefined8 local_10c0;
  char *local_10b8;
  undefined1 local_10b0;
  undefined8 local_10a8;
  char *local_10a0;
  undefined1 local_1098;
  undefined8 local_1090;
  char *local_1088;
  undefined1 local_1080;
  undefined8 local_1078;
  char *local_1070;
  undefined1 local_1068;
  undefined8 local_1060;
  char *local_1058;
  undefined1 local_1050;
  undefined8 local_1048;
  char *local_1040;
  undefined1 local_1038;
  undefined8 local_1030;
  char *local_1028;
  undefined1 local_1020;
  undefined8 local_1018;
  char *local_1010;
  undefined1 local_1008;
  undefined8 local_1000;
  char *local_ff8;
  undefined1 local_ff0;
  undefined8 local_fe8;
  char *local_fe0;
  undefined1 local_fd8;
  undefined8 local_fd0;
  char *local_fc8;
  undefined1 local_fc0;
  undefined8 local_fb8;
  char *local_fb0;
  undefined1 local_fa8;
  undefined8 local_fa0;
  char *local_f98;
  undefined1 local_f90;
  undefined8 local_f88;
  char *local_f80;
  undefined1 local_f78;
  undefined8 local_f70;
  char *local_f68;
  undefined1 local_f60;
  undefined8 local_f58;
  char *local_f50;
  undefined1 local_f48;
  undefined8 local_f40;
  char *local_f38;
  undefined1 local_f30;
  undefined8 local_f28;
  char *local_f20;
  undefined1 local_f18;
  undefined8 local_f10;
  char *local_f08;
  undefined1 local_f00;
  undefined8 local_ef8;
  char *local_ef0;
  undefined1 local_ee8;
  undefined8 local_ee0;
  char *local_ed8;
  undefined1 local_ed0;
  undefined8 local_ec8;
  char *local_ec0;
  undefined1 local_eb8;
  undefined8 local_eb0;
  char *local_ea8;
  undefined1 local_ea0;
  undefined8 local_e98;
  char *local_e90;
  undefined1 local_e88;
  undefined8 local_e80;
  char *local_e78;
  undefined1 local_e70;
  undefined8 local_e68;
  char *local_e60;
  undefined1 local_e58;
  undefined8 local_e50;
  char *local_e48;
  undefined1 local_e40;
  undefined8 local_e38;
  char *local_e30;
  undefined1 local_e28;
  undefined8 local_e20;
  char *local_e18;
  undefined1 local_e10;
  undefined8 local_e08;
  char *local_e00;
  undefined1 local_df8;
  undefined8 local_df0;
  char *local_de8;
  undefined1 local_de0;
  undefined8 local_dd8;
  char *local_dd0;
  undefined1 local_dc8;
  undefined8 local_dc0;
  char *local_db8;
  undefined1 local_db0;
  undefined8 local_da8;
  char *local_da0;
  undefined1 local_d98;
  undefined8 local_d90;
  char *local_d88;
  undefined1 local_d80;
  undefined8 local_d78;
  char *local_d70;
  undefined1 local_d68;
  undefined8 local_d60;
  char *local_d58;
  undefined1 local_d50;
  undefined8 local_d48;
  char *local_d40;
  undefined1 local_d38;
  undefined8 local_d30;
  char *local_d28;
  undefined1 local_d20;
  undefined8 local_d18;
  char *local_d10;
  undefined1 local_d08;
  undefined8 local_d00;
  char *local_cf8;
  undefined1 local_cf0;
  undefined8 local_ce8;
  char *local_ce0;
  undefined1 local_cd8;
  undefined8 local_cd0;
  char *local_cc8;
  undefined1 local_cc0;
  undefined8 local_cb8;
  char *local_cb0;
  undefined1 local_ca8;
  undefined8 local_ca0;
  char *local_c98;
  undefined1 local_c90;
  undefined8 local_c88;
  char *local_c80;
  undefined1 local_c78;
  undefined8 local_c70;
  char *local_c68;
  undefined1 local_c60;
  undefined8 local_c58;
  char *local_c50;
  undefined1 local_c48;
  undefined8 local_c40;
  char *local_c38;
  undefined1 local_c30;
  undefined8 local_c28;
  char *local_c20;
  undefined1 local_c18;
  undefined8 local_c10;
  char *local_c08;
  undefined1 local_c00;
  undefined8 local_bf8;
  char *local_bf0;
  undefined1 local_be8;
  undefined8 local_be0;
  char *local_bd8;
  undefined1 local_bd0;
  undefined8 local_bc8;
  char *local_bc0;
  undefined1 local_bb8;
  undefined8 local_bb0;
  char *local_ba8;
  undefined1 local_ba0;
  undefined8 local_b98;
  char *local_b90;
  undefined1 local_b88;
  undefined8 local_b80;
  char *local_b78;
  undefined1 local_b70;
  undefined8 local_b68;
  char *local_b60;
  undefined1 local_b58;
  undefined8 local_b50;
  char *local_b48;
  undefined1 local_b40;
  undefined8 local_b38;
  char *local_b30;
  undefined1 local_b28;
  undefined8 local_b20;
  char *local_b18;
  undefined1 local_b10;
  undefined8 local_b08;
  char *local_b00;
  undefined1 local_af8;
  undefined8 local_af0;
  char *local_ae8;
  undefined1 local_ae0;
  undefined8 local_ad8;
  char *local_ad0;
  undefined1 local_ac8;
  undefined8 local_ac0;
  char *local_ab8;
  undefined1 local_ab0;
  undefined8 local_aa8;
  char *local_aa0;
  undefined1 local_a98;
  undefined8 local_a90;
  char *local_a88;
  undefined1 local_a80;
  undefined8 local_a78;
  char *local_a70;
  undefined1 local_a68;
  undefined8 local_a60;
  char *local_a58;
  undefined1 local_a50;
  undefined8 local_a48;
  char *local_a40;
  undefined1 local_a38;
  undefined8 local_a30;
  char *local_a28;
  undefined1 local_a20;
  undefined8 local_a18;
  char *local_a10;
  undefined1 local_a08;
  undefined8 local_a00;
  char *local_9f8;
  undefined1 local_9f0;
  undefined8 local_9e8;
  char *local_9e0;
  undefined1 local_9d8;
  undefined8 local_9d0;
  char *local_9c8;
  undefined1 local_9c0;
  undefined8 local_9b8;
  char *local_9b0;
  undefined1 local_9a8;
  undefined8 local_9a0;
  char *local_998;
  undefined1 local_990;
  undefined8 local_988;
  char *local_980;
  undefined1 local_978;
  undefined8 local_970;
  char *local_968;
  undefined1 local_960;
  undefined8 local_958;
  char *local_950;
  undefined1 local_948;
  undefined8 local_940;
  char *local_938;
  undefined1 local_930;
  undefined8 local_928;
  char *local_920;
  undefined1 local_918;
  undefined8 local_910;
  char *local_908;
  undefined1 local_900;
  undefined8 local_8f8;
  char *local_8f0;
  undefined1 local_8e8;
  undefined8 local_8e0;
  char *local_8d8;
  undefined1 local_8d0;
  undefined8 local_8c8;
  char *local_8c0;
  undefined1 local_8b8;
  undefined8 local_8b0;
  char *local_8a8;
  undefined1 local_8a0;
  undefined8 local_898;
  char *local_890;
  undefined1 local_888;
  undefined8 local_880;
  char *local_878;
  undefined1 local_870;
  undefined8 local_868;
  char *local_860;
  undefined1 local_858;
  undefined8 local_850;
  char *local_848;
  undefined1 local_840;
  undefined8 local_838;
  char *local_830;
  undefined1 local_828;
  undefined8 local_820;
  char *local_818;
  undefined1 local_810;
  undefined8 local_808;
  char *local_800;
  undefined1 local_7f8;
  undefined8 local_7f0;
  char *local_7e8;
  undefined1 local_7e0;
  undefined8 local_7d8;
  char *local_7d0;
  undefined1 local_7c8;
  undefined8 local_7c0;
  char *local_7b8;
  undefined1 local_7b0;
  undefined8 local_7a8;
  char *local_7a0;
  undefined1 local_798;
  undefined8 local_790;
  char *local_788;
  undefined1 local_780;
  undefined8 local_778;
  char *local_770;
  undefined1 local_768;
  undefined8 local_760;
  char *local_758;
  undefined1 local_750;
  undefined8 local_748;
  char *local_740;
  undefined1 local_738;
  undefined8 local_730;
  char *local_728;
  undefined1 local_720;
  undefined8 local_718;
  char *local_710;
  undefined1 local_708;
  undefined8 local_700;
  char *local_6f8;
  undefined1 local_6f0;
  undefined8 local_6e8;
  char *local_6e0;
  undefined1 local_6d8;
  undefined8 local_6d0;
  char *local_6c8;
  undefined1 local_6c0;
  undefined8 local_6b8;
  char *local_6b0;
  undefined1 local_6a8;
  undefined8 local_6a0;
  char *local_698;
  undefined1 local_690;
  undefined8 local_688;
  char *local_680;
  undefined1 local_678;
  undefined8 local_670;
  char *local_668;
  undefined1 local_660;
  undefined8 local_658;
  char *local_650;
  undefined1 local_648;
  undefined8 local_640;
  char *local_638;
  undefined1 local_630;
  undefined8 local_628;
  char *local_620;
  undefined1 local_618;
  undefined8 local_610;
  char *local_608;
  undefined1 local_600;
  undefined8 local_5f8;
  char *local_5f0;
  undefined1 local_5e8;
  undefined8 local_5e0;
  char *local_5d8;
  undefined1 local_5d0;
  undefined8 local_5c8;
  char *local_5c0;
  undefined1 local_5b8;
  undefined8 local_5b0;
  char *local_5a8;
  undefined1 local_5a0;
  undefined8 local_598;
  char *local_590;
  undefined1 local_588;
  undefined8 local_580;
  char *local_578;
  undefined1 local_570;
  undefined8 local_568;
  char *local_560;
  undefined1 local_558;
  undefined8 local_550;
  char *local_548;
  undefined1 local_540;
  undefined8 local_538;
  char *local_530;
  undefined1 local_528;
  undefined8 local_520;
  char *local_518;
  undefined1 local_510;
  undefined8 local_508;
  char *local_500;
  undefined1 local_4f8;
  undefined8 local_4f0;
  char *local_4e8;
  undefined1 local_4e0;
  undefined8 local_4d8;
  char *local_4d0;
  undefined1 local_4c8;
  undefined8 local_4c0;
  char *local_4b8;
  undefined1 local_4b0;
  undefined8 local_4a8;
  char *local_4a0;
  undefined1 local_498;
  undefined8 local_490;
  char *local_488;
  undefined1 local_480;
  undefined8 local_478;
  char *local_470;
  undefined1 local_468;
  undefined8 local_460;
  char *local_458;
  undefined1 local_450;
  undefined8 local_448;
  char *local_440;
  undefined1 local_438;
  undefined8 local_430;
  char *local_428;
  undefined1 local_420;
  undefined8 local_418;
  char *local_410;
  undefined1 local_408;
  undefined8 local_400;
  char *local_3f8;
  undefined1 local_3f0;
  undefined8 local_3e8;
  char *local_3e0;
  undefined1 local_3d8;
  undefined8 local_3d0;
  char *local_3c8;
  undefined1 local_3c0;
  undefined8 local_3b8;
  char *local_3b0;
  undefined1 local_3a8;
  undefined8 local_3a0;
  char *local_398;
  undefined1 local_390;
  undefined8 local_388;
  char *local_380;
  undefined1 local_378;
  undefined8 local_370;
  char *local_368;
  undefined1 local_360;
  undefined8 local_358;
  char *local_350;
  undefined1 local_348;
  undefined8 local_340;
  char *local_338;
  undefined1 local_330;
  undefined8 local_328;
  char *local_320;
  undefined1 local_318;
  undefined8 local_310;
  char *local_308;
  undefined1 local_300;
  undefined8 local_2f8;
  char *local_2f0;
  undefined1 local_2e8;
  undefined8 local_2e0;
  char *local_2d8;
  undefined1 local_2d0;
  undefined8 local_2c8;
  char *local_2c0;
  undefined1 local_2b8;
  undefined8 local_2b0;
  char *local_2a8;
  undefined1 local_2a0;
  undefined8 local_298;
  char *local_290;
  undefined1 local_288;
  undefined8 local_280;
  char *local_278;
  undefined1 local_270;
  undefined8 local_268;
  char *local_260;
  undefined1 local_258;
  undefined8 local_250;
  char *local_248;
  undefined1 local_240;
  undefined8 local_238;
  char *local_230;
  undefined1 local_228;
  undefined8 local_220;
  char *local_218;
  undefined1 local_210;
  undefined8 local_208;
  char *local_200;
  undefined1 local_1f8;
  undefined8 local_1f0;
  char *local_1e8;
  undefined1 local_1e0;
  undefined8 local_1d8;
  char *local_1d0;
  undefined1 local_1c8;
  undefined8 local_1c0;
  char *local_1b8;
  undefined1 local_1b0;
  undefined8 local_1a8;
  char *local_1a0;
  undefined1 local_198;
  undefined8 local_190;
  char *local_188;
  undefined1 local_180;
  undefined8 local_178;
  char *local_170;
  undefined1 local_168;
  undefined8 local_160;
  char *local_158;
  undefined1 local_150;
  undefined8 local_148;
  char *local_140;
  undefined1 local_138;
  undefined8 local_130;
  char *local_128;
  undefined1 local_120;
  undefined8 local_118;
  char *local_110;
  undefined1 local_108;
  undefined8 local_100;
  char *local_f8;
  undefined1 local_f0;
  undefined8 local_e8;
  char *local_e0;
  undefined1 local_d8;
  undefined8 local_d0;
  char *local_c8;
  undefined1 local_c0;
  undefined8 local_b8;
  char *local_b0;
  undefined1 local_a8;
  undefined8 local_a0;
  char *local_98;
  undefined1 local_90;
  undefined8 local_88;
  char *local_80;
  undefined1 local_78;
  undefined8 local_70;
  char *local_68;
  undefined1 local_60;
  undefined8 local_58;
  char *local_50;
  undefined1 local_48;
  undefined8 local_40;
  char *local_38;
  
  local_1d10[0] = 0x41;
  local_1d10._8_8_ = 6;
  local_1d00 = "ACTION";
  local_1cf8 = 0x41;
  local_1cf0 = 3;
  local_1ce8 = "ADD";
  local_1ce0 = 0x41;
  local_1cd8 = 5;
  local_1cd0 = "AFTER";
  local_1cc8 = 0x41;
  local_1cc0 = 9;
  local_1cb8 = "ALGORITHM";
  local_1cb0 = 0x41;
  local_1ca8 = 3;
  local_1ca0 = "ALL";
  local_1c98 = 0x41;
  local_1c90 = 5;
  local_1c88 = "ALTER";
  local_1c80 = 0x41;
  local_1c78 = 7;
  local_1c70 = "ANALYZE";
  local_1c68 = 0x41;
  local_1c60 = 3;
  local_1c58 = "ANY";
  local_1c50 = 0x41;
  local_1c48 = 5;
  local_1c40 = "APPLY";
  local_1c38 = 0x41;
  local_1c30 = 2;
  local_1c28 = "AS";
  local_1c20 = 0x41;
  local_1c18 = 3;
  local_1c10 = "ASC";
  local_1c08 = 0x41;
  local_1c00 = 0xd;
  local_1bf8 = "AUTHORIZATION";
  local_1bf0 = 0x41;
  local_1be8 = 0xe;
  local_1be0 = "AUTO_INCREMENT";
  local_1bd8 = 0x42;
  local_1bd0 = 6;
  local_1bc8 = "BACKUP";
  local_1bc0 = 0x42;
  local_1bb8 = 3;
  local_1bb0 = "BDB";
  local_1ba8 = 0x42;
  local_1ba0 = 5;
  local_1b98 = "BEGIN";
  local_1b90 = 0x42;
  local_1b88 = 10;
  local_1b80 = "BERKELEYDB";
  local_1b78 = 0x42;
  local_1b70 = 6;
  local_1b68 = "BIGINT";
  local_1b60 = 0x42;
  local_1b58 = 6;
  local_1b50 = "BINARY";
  local_1b48 = 0x42;
  local_1b40 = 3;
  local_1b38 = "BIT";
  local_1b30 = 0x42;
  local_1b28 = 4;
  local_1b20 = "BLOB";
  local_1b18 = 0x42;
  local_1b10 = 4;
  local_1b08 = "BOOL";
  local_1b00 = 0x42;
  local_1af8 = 7;
  local_1af0 = "BOOLEAN";
  local_1ae8 = 0x42;
  local_1ae0 = 5;
  local_1ad8 = "BREAK";
  local_1ad0 = 0x42;
  local_1ac8 = 6;
  local_1ac0 = "BROWSE";
  local_1ab8 = 0x42;
  local_1ab0 = 5;
  local_1aa8 = "BTREE";
  local_1aa0 = 0x42;
  local_1a98 = 4;
  local_1a90 = "BULK";
  local_1a88 = 0x42;
  local_1a80 = 2;
  local_1a78 = "BY";
  local_1a70 = 0x43;
  local_1a68 = 4;
  local_1a60 = "CALL";
  local_1a58 = 0x43;
  local_1a50 = 8;
  local_1a48 = "CASCADED";
  local_1a40 = 0x43;
  local_1a38 = 4;
  local_1a30 = "CASE";
  local_1a28 = 0x43;
  local_1a20 = 5;
  local_1a18 = "CHAIN";
  local_1a10 = 0x43;
  local_1a08 = 9;
  local_1a00 = "CHARACTER";
  local_19f8 = 0x53;
  local_19f0 = 3;
  local_19e8 = "SET";
  local_19e0 = 0x43;
  local_19d8 = 10;
  local_19d0 = "CHECKPOINT";
  local_19c8 = 0x43;
  local_19c0 = 5;
  local_19b8 = "CLOSE";
  local_19b0 = 0x43;
  local_19a8 = 9;
  local_19a0 = "CLUSTERED";
  local_1998 = 0x43;
  local_1990 = 8;
  local_1988 = "COALESCE";
  local_1980 = 0x43;
  local_1978 = 7;
  local_1970 = "COLLATE";
  local_1968 = 0x43;
  local_1960 = 7;
  local_1958 = "COLUMNS";
  local_1950 = 0x43;
  local_1948 = 7;
  local_1940 = "COMMENT";
  local_1938 = 0x43;
  local_1930 = 9;
  local_1928 = "COMMITTED";
  local_1920 = 0x43;
  local_1918 = 7;
  local_1910 = "COMPUTE";
  local_1908 = 0x43;
  local_1900 = 7;
  local_18f8 = "CONNECT";
  local_18f0 = 0x43;
  local_18e8 = 10;
  local_18e0 = "CONSISTENT";
  local_18d8 = 0x43;
  local_18d0 = 10;
  local_18c8 = "CONSTRAINT";
  local_18c0 = 0x43;
  local_18b8 = 0xd;
  local_18b0 = "CONTAINSTABLE";
  local_18a8 = 0x43;
  local_18a0 = 8;
  local_1898 = "CONTINUE";
  local_1890 = 0x43;
  local_1888 = 7;
  local_1880 = "CONVERT";
  local_1878 = 0x43;
  local_1870 = 6;
  local_1868 = "CREATE";
  local_1860 = 0x43;
  local_1858 = 5;
  local_1850 = "CROSS";
  local_1848 = 0x43;
  local_1840 = 0xc;
  local_1838 = "CURRENT_DATE";
  local_1830 = 0x5f;
  local_1828 = 5;
  local_1820 = "_TIME";
  local_1818 = 0x5f;
  local_1810 = 10;
  local_1808 = "_TIMESTAMP";
  local_1800 = 0x5f;
  local_17f8 = 5;
  local_17f0 = "_USER";
  local_17e8 = 0x43;
  local_17e0 = 6;
  local_17d8 = "CURSOR";
  local_17d0 = 0x43;
  local_17c8 = 5;
  local_17c0 = "CYCLE";
  local_17b8 = 0x44;
  local_17b0 = 9;
  local_17a8 = "DATABASES";
  local_17a0 = 0x44;
  local_1798 = 8;
  local_1790 = "DATETIME";
  local_1788 = 0x44;
  local_1780 = 3;
  local_1778 = "DAY";
  local_1770 = 0x44;
  local_1768 = 4;
  local_1760 = "DBCC";
  local_1758 = 0x44;
  local_1750 = 10;
  local_1748 = "DEALLOCATE";
  local_1740 = 0x44;
  local_1738 = 3;
  local_1730 = "DEC";
  local_1728 = 0x44;
  local_1720 = 7;
  local_1718 = "DECIMAL";
  local_1710 = 0x44;
  local_1708 = 7;
  local_1700 = "DECLARE";
  local_16f8 = 0x44;
  local_16f0 = 7;
  local_16e8 = "DEFAULT";
  local_16e0 = 0x44;
  local_16d8 = 7;
  local_16d0 = "DEFINER";
  local_16c8 = 0x44;
  local_16c0 = 7;
  local_16b8 = "DELAYED";
  local_16b0 = 0x44;
  local_16a8 = 6;
  local_16a0 = "DELETE";
  local_1698 = 0x44;
  local_1690 = 10;
  local_1688 = "DELIMITERS";
  local_1680 = 0x44;
  local_1678 = 4;
  local_1670 = "DENY";
  local_1668 = 0x44;
  local_1660 = 4;
  local_1658 = "DESC";
  local_1650 = 0x44;
  local_1648 = 8;
  local_1640 = "DESCRIBE";
  local_1638 = 0x44;
  local_1630 = 0xd;
  local_1628 = "DETERMINISTIC";
  local_1620 = 0x44;
  local_1618 = 7;
  local_1610 = "DISABLE";
  local_1608 = 0x44;
  local_1600 = 7;
  local_15f8 = "DISCARD";
  local_15f0 = 0x44;
  local_15e8 = 4;
  local_15e0 = "DISK";
  local_15d8 = 0x44;
  local_15d0 = 8;
  local_15c8 = "DISTINCT";
  local_15c0 = 0x44;
  local_15b8 = 0xb;
  local_15b0 = "DISTINCTROW";
  local_15a8 = 0x44;
  local_15a0 = 0xb;
  local_1598 = "DISTRIBUTED";
  local_1590 = 0x44;
  local_1588 = 2;
  local_1580 = "DO";
  local_1578 = 0x44;
  local_1570 = 6;
  local_1568 = "DOUBLE";
  local_1560 = 0x44;
  local_1558 = 4;
  local_1550 = "DROP";
  local_1548 = 0x44;
  local_1540 = 5;
  local_1538 = "DUMMY";
  local_1530 = 0x44;
  local_1528 = 8;
  local_1520 = "DUMPFILE";
  local_1518 = 0x44;
  local_1510 = 9;
  local_1508 = "DUPLICATE";
  local_1500 = 0x45;
  local_14f8 = 6;
  local_14f0 = "ELSEIF";
  local_14e8 = 0x45;
  local_14e0 = 6;
  local_14d8 = "ENABLE";
  local_14d0 = 0x45;
  local_14c8 = 8;
  local_14c0 = "ENCLOSED";
  local_14b8 = 0x45;
  local_14b0 = 3;
  local_14a8 = "END";
  local_14a0 = 0x45;
  local_1498 = 6;
  local_1490 = "ENGINE";
  local_1488 = 0x45;
  local_1480 = 4;
  local_1478 = "ENUM";
  local_1470 = 0x45;
  local_1468 = 6;
  local_1460 = "ERRLVL";
  local_1458 = 0x45;
  local_1450 = 6;
  local_1448 = "ERRORS";
  local_1440 = 0x45;
  local_1438 = 7;
  local_1430 = "ESCAPED";
  local_1428 = 0x45;
  local_1420 = 6;
  local_1418 = "EXCEPT";
  local_1410 = 0x45;
  local_1408 = 7;
  local_1400 = "EXECUTE";
  local_13f8 = 0x45;
  local_13f0 = 6;
  local_13e8 = "EXISTS";
  local_13e0 = 0x45;
  local_13d8 = 4;
  local_13d0 = "EXIT";
  local_13c8 = 0x45;
  local_13c0 = 7;
  local_13b8 = "EXPLAIN";
  local_13b0 = 0x45;
  local_13a8 = 8;
  local_13a0 = "EXTENDED";
  local_1398 = 0x46;
  local_1390 = 5;
  local_1388 = "FETCH";
  local_1380 = 0x46;
  local_1378 = 6;
  local_1370 = "FIELDS";
  local_1368 = 0x46;
  local_1360 = 4;
  local_1358 = "FILE";
  local_1350 = 0x46;
  local_1348 = 10;
  local_1340 = "FILLFACTOR";
  local_1338 = 0x46;
  local_1330 = 5;
  local_1328 = "FIRST";
  local_1320 = 0x46;
  local_1318 = 5;
  local_1310 = "FIXED";
  local_1308 = 0x46;
  local_1300 = 5;
  local_12f8 = "FLOAT";
  local_12f0 = 0x46;
  local_12e8 = 9;
  local_12e0 = "FOLLOWING";
  local_12d8 = 0x46;
  local_12d0 = 3;
  local_12c8 = "FOR";
  local_12c0 = 0x45;
  local_12b8 = 4;
  local_12b0 = "EACH";
  local_12a8 = 0x52;
  local_12a0 = 3;
  local_1298 = "ROW";
  local_1290 = 0x46;
  local_1288 = 5;
  local_1280 = "FORCE";
  local_1278 = 0x46;
  local_1270 = 7;
  local_1268 = "FOREIGN";
  local_1260 = 0x46;
  local_1258 = 0xd;
  local_1250 = "FREETEXTTABLE";
  local_1248 = 0x46;
  local_1240 = 4;
  local_1238 = "FROM";
  local_1230 = 0x46;
  local_1228 = 4;
  local_1220 = "FULL";
  local_1218 = 0x46;
  local_1210 = 8;
  local_1208 = "FUNCTION";
  local_1200 = 0x47;
  local_11f8 = 0x12;
  local_11f0 = "GEOMETRYCOLLECTION";
  local_11e8 = 0x47;
  local_11e0 = 6;
  local_11d8 = "GLOBAL";
  local_11d0 = 0x47;
  local_11c8 = 4;
  local_11c0 = "GOTO";
  local_11b8 = 0x47;
  local_11b0 = 5;
  local_11a8 = "GRANT";
  local_11a0 = 0x47;
  local_1198 = 5;
  local_1190 = "GROUP";
  local_1188 = 0x48;
  local_1180 = 7;
  local_1178 = "HANDLER";
  local_1170 = 0x48;
  local_1168 = 4;
  local_1160 = "HASH";
  local_1158 = 0x48;
  local_1150 = 6;
  local_1148 = "HAVING";
  local_1140 = 0x48;
  local_1138 = 8;
  local_1130 = "HOLDLOCK";
  local_1128 = 0x48;
  local_1120 = 4;
  local_1118 = "HOUR";
  local_1110 = 0x49;
  local_1108 = 0xf;
  local_1100 = "IDENTITY_INSERT";
  local_10f8 = 0x43;
  local_10f0 = 3;
  local_10e8 = "COL";
  local_10e0 = 0x49;
  local_10d8 = 2;
  local_10d0 = "IF";
  local_10c8 = 0x49;
  local_10c0 = 6;
  local_10b8 = "IGNORE";
  local_10b0 = 0x49;
  local_10a8 = 6;
  local_10a0 = "IMPORT";
  local_1098 = 0x49;
  local_1090 = 5;
  local_1088 = "INDEX";
  local_1080 = 0x49;
  local_1078 = 6;
  local_1070 = "INFILE";
  local_1068 = 0x49;
  local_1060 = 5;
  local_1058 = "INNER";
  local_1050 = 0x49;
  local_1048 = 6;
  local_1040 = "INNODB";
  local_1038 = 0x49;
  local_1030 = 5;
  local_1028 = "INOUT";
  local_1020 = 0x49;
  local_1018 = 6;
  local_1010 = "INSERT";
  local_1008 = 0x49;
  local_1000 = 3;
  local_ff8 = "INT";
  local_ff0 = 0x49;
  local_fe8 = 7;
  local_fe0 = "INTEGER";
  local_fd8 = 0x49;
  local_fd0 = 9;
  local_fc8 = "INTERSECT";
  local_fc0 = 0x49;
  local_fb8 = 8;
  local_fb0 = "INTERVAL";
  local_fa8 = 0x49;
  local_fa0 = 4;
  local_f98 = "INTO";
  local_f90 = 0x49;
  local_f88 = 7;
  local_f80 = "INVOKER";
  local_f78 = 0x49;
  local_f70 = 9;
  local_f68 = "ISOLATION";
  local_f60 = 0x49;
  local_f58 = 7;
  local_f50 = "ITERATE";
  local_f48 = 0x4a;
  local_f40 = 4;
  local_f38 = "JOIN";
  local_f30 = 0x4b;
  local_f28 = 4;
  local_f20 = "KEYS";
  local_f18 = 0x4b;
  local_f10 = 4;
  local_f08 = "KILL";
  local_f00 = 0x4c;
  local_ef8 = 8;
  local_ef0 = "LANGUAGE";
  local_ee8 = 0x4c;
  local_ee0 = 4;
  local_ed8 = "LAST";
  local_ed0 = 0x4c;
  local_ec8 = 5;
  local_ec0 = "LEAVE";
  local_eb8 = 0x4c;
  local_eb0 = 4;
  local_ea8 = "LEFT";
  local_ea0 = 0x4c;
  local_e98 = 5;
  local_e90 = "LEVEL";
  local_e88 = 0x4c;
  local_e80 = 5;
  local_e78 = "LIMIT";
  local_e70 = 0x4c;
  local_e68 = 6;
  local_e60 = "LINENO";
  local_e58 = 0x4c;
  local_e50 = 5;
  local_e48 = "LINES";
  local_e40 = 0x4c;
  local_e38 = 10;
  local_e30 = "LINESTRING";
  local_e28 = 0x4c;
  local_e20 = 4;
  local_e18 = "LOAD";
  local_e10 = 0x4c;
  local_e08 = 5;
  local_e00 = "LOCAL";
  local_df8 = 0x4c;
  local_df0 = 4;
  local_de8 = "LOCK";
  local_de0 = 0x4c;
  local_dd8 = 8;
  local_dd0 = "LONGBLOB";
  local_dc8 = 0x54;
  local_dc0 = 4;
  local_db8 = "TEXT";
  local_db0 = 0x4c;
  local_da8 = 4;
  local_da0 = "LOOP";
  local_d98 = 0x4d;
  local_d90 = 7;
  local_d88 = "MATCHED";
  local_d80 = 0x4d;
  local_d78 = 10;
  local_d70 = "MEDIUMBLOB";
  local_d68 = 0x49;
  local_d60 = 3;
  local_d58 = "INT";
  local_d50 = 0x54;
  local_d48 = 4;
  local_d40 = "TEXT";
  local_d38 = 0x4d;
  local_d30 = 5;
  local_d28 = "MERGE";
  local_d20 = 0x4d;
  local_d18 = 9;
  local_d10 = "MIDDLEINT";
  local_d08 = 0x4d;
  local_d00 = 6;
  local_cf8 = "MINUTE";
  local_cf0 = 0x4d;
  local_ce8 = 4;
  local_ce0 = "MODE";
  local_cd8 = 0x4d;
  local_cd0 = 8;
  local_cc8 = "MODIFIES";
  local_cc0 = 0x4d;
  local_cb8 = 6;
  local_cb0 = "MODIFY";
  local_ca8 = 0x4d;
  local_ca0 = 5;
  local_c98 = "MONTH";
  local_c90 = 0x4d;
  local_c88 = 0xf;
  local_c80 = "MULTILINESTRING";
  local_c78 = 0x50;
  local_c70 = 5;
  local_c68 = "POINT";
  local_c60 = 0x50;
  local_c58 = 7;
  local_c50 = "POLYGON";
  local_c48 = 0x4e;
  local_c40 = 8;
  local_c38 = "NATIONAL";
  local_c30 = 0x4e;
  local_c28 = 7;
  local_c20 = "NATURAL";
  local_c18 = 0x4e;
  local_c10 = 5;
  local_c08 = "NCHAR";
  local_c00 = 0x4e;
  local_bf8 = 4;
  local_bf0 = "NEXT";
  local_be8 = 0x4e;
  local_be0 = 2;
  local_bd8 = "NO";
  local_bd0 = 0x4e;
  local_bc8 = 0xc;
  local_bc0 = "NONCLUSTERED";
  local_bb8 = 0x4e;
  local_bb0 = 6;
  local_ba8 = "NULLIF";
  local_ba0 = 0x4e;
  local_b98 = 7;
  local_b90 = "NUMERIC";
  local_b88 = 0x4f;
  local_b80 = 3;
  local_b78 = "OFF";
  local_b70 = 0x4f;
  local_b68 = 7;
  local_b60 = "OFFSETS";
  local_b58 = 0x4f;
  local_b50 = 2;
  local_b48 = "ON";
  local_b40 = 0x4f;
  local_b38 = 0xe;
  local_b30 = "OPENDATASOURCE";
  local_b28 = 0x51;
  local_b20 = 5;
  local_b18 = "QUERY";
  local_b10 = 0x52;
  local_b08 = 6;
  local_b00 = "ROWSET";
  local_af8 = 0x4f;
  local_af0 = 8;
  local_ae8 = "OPTIMIZE";
  local_ae0 = 0x4f;
  local_ad8 = 10;
  local_ad0 = "OPTIONALLY";
  local_ac8 = 0x4f;
  local_ac0 = 5;
  local_ab8 = "ORDER";
  local_ab0 = 0x4f;
  local_aa8 = 5;
  local_aa0 = "OUTER";
  local_a98 = 0x46;
  local_a90 = 4;
  local_a88 = "FILE";
  local_a80 = 0x4f;
  local_a78 = 4;
  local_a70 = "OVER";
  local_a68 = 0x50;
  local_a60 = 7;
  local_a58 = "PARTIAL";
  local_a50 = 0x50;
  local_a48 = 9;
  local_a40 = "PARTITION";
  local_a38 = 0x50;
  local_a30 = 7;
  local_a28 = "PERCENT";
  local_a20 = 0x50;
  local_a18 = 5;
  local_a10 = "PIVOT";
  local_a08 = 0x50;
  local_a00 = 4;
  local_9f8 = "PLAN";
  local_9f0 = 0x50;
  local_9e8 = 5;
  local_9e0 = "POINT";
  local_9d8 = 0x50;
  local_9d0 = 7;
  local_9c8 = "POLYGON";
  local_9c0 = 0x50;
  local_9b8 = 9;
  local_9b0 = "PRECEDING";
  local_9a8 = 0x50;
  local_9a0 = 9;
  local_998 = "PRECISION";
  local_990 = 0x50;
  local_988 = 7;
  local_980 = "PREPARE";
  local_978 = 0x50;
  local_970 = 4;
  local_968 = "PREV";
  local_960 = 0x50;
  local_958 = 7;
  local_950 = "PRIMARY";
  local_948 = 0x50;
  local_940 = 5;
  local_938 = "PRINT";
  local_930 = 0x50;
  local_928 = 10;
  local_920 = "PRIVILEGES";
  local_918 = 0x50;
  local_910 = 9;
  local_908 = "PROCEDURE";
  local_900 = 0x50;
  local_8f8 = 6;
  local_8f0 = "PUBLIC";
  local_8e8 = 0x50;
  local_8e0 = 5;
  local_8d8 = "PURGE";
  local_8d0 = 0x51;
  local_8c8 = 5;
  local_8c0 = "QUICK";
  local_8b8 = 0x52;
  local_8b0 = 9;
  local_8a8 = "RAISERROR";
  local_8a0 = 0x52;
  local_898 = 5;
  local_890 = "READS";
  local_888 = 0x52;
  local_880 = 4;
  local_878 = "REAL";
  local_870 = 0x52;
  local_868 = 0xb;
  local_860 = "RECONFIGURE";
  local_858 = 0x52;
  local_850 = 10;
  local_848 = "REFERENCES";
  local_840 = 0x52;
  local_838 = 7;
  local_830 = "RELEASE";
  local_828 = 0x52;
  local_820 = 6;
  local_818 = "RENAME";
  local_810 = 0x52;
  local_808 = 10;
  local_800 = "REPEATABLE";
  local_7f8 = 0x52;
  local_7f0 = 7;
  local_7e8 = "REPLACE";
  local_7e0 = 0x52;
  local_7d8 = 0xb;
  local_7d0 = "REPLICATION";
  local_7c8 = 0x52;
  local_7c0 = 7;
  local_7b8 = "REQUIRE";
  local_7b0 = 0x52;
  local_7a8 = 8;
  local_7a0 = "RESIGNAL";
  local_798 = 0x52;
  local_790 = 7;
  local_788 = "RESTORE";
  local_780 = 0x52;
  local_778 = 8;
  local_770 = "RESTRICT";
  local_768 = 0x52;
  local_760 = 7;
  local_758 = "RETURNS";
  local_750 = 0x52;
  local_748 = 6;
  local_740 = "REVOKE";
  local_738 = 0x52;
  local_730 = 5;
  local_728 = "RIGHT";
  local_720 = 0x52;
  local_718 = 8;
  local_710 = "ROLLBACK";
  local_708 = 0x52;
  local_700 = 7;
  local_6f8 = "ROUTINE";
  local_6f0 = 0x52;
  local_6e8 = 8;
  local_6e0 = "ROWCOUNT";
  local_6d8 = 0x47;
  local_6d0 = 7;
  local_6c8 = "GUIDCOL";
  local_6c0 = 0x52;
  local_6b8 = 5;
  local_6b0 = "RTREE";
  local_6a8 = 0x52;
  local_6a0 = 4;
  local_698 = "RULE";
  local_690 = 0x53;
  local_688 = 9;
  local_680 = "SAVEPOINT";
  local_678 = 0x53;
  local_670 = 6;
  local_668 = "SCHEMA";
  local_660 = 0x53;
  local_658 = 6;
  local_650 = "SECOND";
  local_648 = 0x53;
  local_640 = 6;
  local_638 = "SELECT";
  local_630 = 0x53;
  local_628 = 0xc;
  local_620 = "SERIALIZABLE";
  local_618 = 0x53;
  local_610 = 0xc;
  local_608 = "SESSION_USER";
  local_600 = 0x53;
  local_5f8 = 7;
  local_5f0 = "SETUSER";
  local_5e8 = 0x53;
  local_5e0 = 5;
  local_5d8 = "SHARE";
  local_5d0 = 0x53;
  local_5c8 = 4;
  local_5c0 = "SHOW";
  local_5b8 = 0x53;
  local_5b0 = 8;
  local_5a8 = "SHUTDOWN";
  local_5a0 = 0x53;
  local_598 = 6;
  local_590 = "SIMPLE";
  local_588 = 0x53;
  local_580 = 8;
  local_578 = "SMALLINT";
  local_570 = 0x53;
  local_568 = 8;
  local_560 = "SNAPSHOT";
  local_558 = 0x53;
  local_550 = 4;
  local_548 = "SOME";
  local_540 = 0x53;
  local_538 = 6;
  local_530 = "SONAME";
  local_528 = 0x53;
  local_520 = 3;
  local_518 = "SQL";
  local_510 = 0x53;
  local_508 = 8;
  local_500 = "STARTING";
  local_4f8 = 0x53;
  local_4f0 = 10;
  local_4e8 = "STATISTICS";
  local_4e0 = 0x53;
  local_4d8 = 6;
  local_4d0 = "STATUS";
  local_4c8 = 0x53;
  local_4c0 = 7;
  local_4b8 = "STRIPED";
  local_4b0 = 0x53;
  local_4a8 = 0xb;
  local_4a0 = "SYSTEM_USER";
  local_498 = 0x54;
  local_490 = 6;
  local_488 = "TABLES";
  local_480 = 0x54;
  local_478 = 10;
  local_470 = "TABLESPACE";
  local_468 = 0x54;
  local_460 = 9;
  local_458 = "TEMPORARY";
  local_450 = 0x54;
  local_448 = 5;
  local_440 = "TABLE";
  local_438 = 0x54;
  local_430 = 10;
  local_428 = "TERMINATED";
  local_420 = 0x54;
  local_418 = 8;
  local_410 = "TEXTSIZE";
  local_408 = 0x54;
  local_400 = 4;
  local_3f8 = "THEN";
  local_3f0 = 0x54;
  local_3e8 = 9;
  local_3e0 = "TIMESTAMP";
  local_3d8 = 0x54;
  local_3d0 = 8;
  local_3c8 = "TINYBLOB";
  local_3c0 = 0x49;
  local_3b8 = 3;
  local_3b0 = "INT";
  local_3a8 = 0x54;
  local_3a0 = 4;
  local_398 = "TEXT";
  local_390 = 0x54;
  local_388 = 3;
  local_380 = "TOP";
  local_378 = 0x54;
  local_370 = 0xc;
  local_368 = "TRANSACTIONS";
  local_360 = 0x54;
  local_358 = 7;
  local_350 = "TRIGGER";
  local_348 = 0x54;
  local_340 = 8;
  local_338 = "TRUNCATE";
  local_330 = 0x54;
  local_328 = 7;
  local_320 = "TSEQUAL";
  local_318 = 0x54;
  local_310 = 5;
  local_308 = "TYPES";
  local_300 = 0x55;
  local_2f8 = 9;
  local_2f0 = "UNBOUNDED";
  local_2e8 = 0x55;
  local_2e0 = 0xb;
  local_2d8 = "UNCOMMITTED";
  local_2d0 = 0x55;
  local_2c8 = 9;
  local_2c0 = "UNDEFINED";
  local_2b8 = 0x55;
  local_2b0 = 5;
  local_2a8 = "UNION";
  local_2a0 = 0x55;
  local_298 = 6;
  local_290 = "UNIQUE";
  local_288 = 0x55;
  local_280 = 6;
  local_278 = "UNLOCK";
  local_270 = 0x55;
  local_268 = 7;
  local_260 = "UNPIVOT";
  local_258 = 0x55;
  local_250 = 8;
  local_248 = "UNSIGNED";
  local_240 = 0x55;
  local_238 = 10;
  local_230 = "UPDATETEXT";
  local_228 = 0x55;
  local_220 = 5;
  local_218 = "USAGE";
  local_210 = 0x55;
  local_208 = 3;
  local_200 = "USE";
  local_1f8 = 0x55;
  local_1f0 = 4;
  local_1e8 = "USER";
  local_1e0 = 0x55;
  local_1d8 = 5;
  local_1d0 = "USING";
  local_1c8 = 0x56;
  local_1c0 = 6;
  local_1b8 = "VALUES";
  local_1b0 = 0x56;
  local_1a8 = 9;
  local_1a0 = "VARBINARY";
  local_198 = 0x43;
  local_190 = 4;
  local_188 = "CHAR";
  local_180 = 0x43;
  local_178 = 9;
  local_170 = "CHARACTER";
  local_168 = 0x59;
  local_160 = 4;
  local_158 = "YING";
  local_150 = 0x56;
  local_148 = 4;
  local_140 = "VIEW";
  local_138 = 0x57;
  local_130 = 7;
  local_128 = "WAITFOR";
  local_120 = 0x57;
  local_118 = 8;
  local_110 = "WARNINGS";
  local_108 = 0x57;
  local_100 = 4;
  local_f8 = "WHEN";
  local_f0 = 0x57;
  local_e8 = 5;
  local_e0 = "WHERE";
  local_d8 = 0x57;
  local_d0 = 5;
  local_c8 = "WHILE";
  local_c0 = 0x57;
  local_b8 = 4;
  local_b0 = "WITH";
  local_a8 = 0x52;
  local_a0 = 6;
  local_98 = "ROLLUP";
  local_90 = 0x49;
  local_88 = 2;
  local_80 = "IN";
  local_78 = 0x57;
  local_70 = 4;
  local_68 = "WORK";
  local_60 = 0x57;
  local_58 = 9;
  local_50 = "WRITETEXT";
  local_48 = 0x59;
  local_40 = 4;
  local_38 = "YEAR";
  pDVar4 = (Data<QHashPrivate::MultiNode<char,_QLatin1String>_> *)operator_new(0x28);
  QHashPrivate::Data<QHashPrivate::MultiNode<char,_QLatin1String>_>::Data(pDVar4,0x134);
  local_1d38.m_size = 0;
  lVar5 = 0;
  local_1d38.d = pDVar4;
  do {
    local_1d39 = local_1d10[lVar5];
    QMultiHash<char,QLatin1String>::emplace<QLatin1String_const&>
              (&local_1d28,&local_1d38,&local_1d39,(QLatin1String *)(local_1d10 + lVar5 + 8));
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x1ce0);
  QVar1.m_size = local_1d38.m_size;
  QVar1.d = local_1d38.d;
  local_1d38.d = (Data *)0x0;
  local_1d38.m_size = 0;
  local_1d28.i.d = sql_keywords.d;
  local_1d28.i.bucket = sql_keywords.m_size;
  sql_keywords = QVar1;
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_1d28);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_1d38);
  local_1d28.i = (piter)ZEXT816(0);
  local_1d10._8_8_ = sql_types.m_size;
  local_1d10._0_8_ = sql_types.d;
  sql_types.d = (Data *)0x0;
  sql_types.m_size = 0;
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)local_1d10);
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_1d28);
  local_1d10[0] = 0x41;
  local_1d10._8_8_ = 4;
  local_1d00 = "TRUE";
  local_1cf8 = 0x46;
  local_1cf0 = 5;
  local_1ce8 = "FALSE";
  local_1ce0 = 0x4e;
  local_1cd8 = 4;
  local_1cd0 = "NULL";
  pDVar4 = (Data<QHashPrivate::MultiNode<char,_QLatin1String>_> *)operator_new(0x28);
  QHashPrivate::Data<QHashPrivate::MultiNode<char,_QLatin1String>_>::Data(pDVar4,3);
  local_1d38.m_size = 0;
  lVar5 = 0;
  local_1d38.d = pDVar4;
  do {
    local_1d39 = local_1d10[lVar5];
    QMultiHash<char,QLatin1String>::emplace<QLatin1String_const&>
              (&local_1d28,&local_1d38,&local_1d39,(QLatin1String *)(local_1d10 + lVar5 + 8));
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x48);
  QVar2.m_size = local_1d38.m_size;
  QVar2.d = local_1d38.d;
  local_1d38.d = (Data *)0x0;
  local_1d38.m_size = 0;
  local_1d28.i.d = sql_literals.d;
  local_1d28.i.bucket = sql_literals.m_size;
  sql_literals = QVar2;
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_1d28);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_1d38);
  local_1d10[0] = 0x41;
  local_1d10._8_8_ = 3;
  local_1d00 = "AVG";
  local_1cf8 = 0x43;
  local_1cf0 = 5;
  local_1ce8 = "COUNT";
  local_1ce0 = 0x46;
  local_1cd8 = 5;
  local_1cd0 = "FIRST";
  local_1cc8 = 0x46;
  local_1cc0 = 6;
  local_1cb8 = "FORMAT";
  local_1cb0 = 0x4c;
  local_1ca8 = 4;
  local_1ca0 = "LAST";
  local_1c98 = 0x4c;
  local_1c90 = 5;
  local_1c88 = "LCASE";
  local_1c80 = 0x4c;
  local_1c78 = 3;
  local_1c70 = "LEN";
  local_1c68 = 0x4d;
  local_1c60 = 3;
  local_1c58 = "MAX";
  local_1c50 = 0x4d;
  local_1c48 = 3;
  local_1c40 = "MID";
  local_1c38 = 0x4d;
  local_1c30 = 3;
  local_1c28 = "MIN";
  local_1c20 = 0x4d;
  local_1c18 = 3;
  local_1c10 = "MOD";
  local_1c08 = 0x4e;
  local_1c00 = 3;
  local_1bf8 = "NOW";
  local_1bf0 = 0x52;
  local_1be8 = 5;
  local_1be0 = "ROUND";
  local_1bd8 = 0x53;
  local_1bd0 = 3;
  local_1bc8 = "SUM";
  local_1bc0 = 0x55;
  local_1bb8 = 5;
  local_1bb0 = "UCASE";
  pDVar4 = (Data<QHashPrivate::MultiNode<char,_QLatin1String>_> *)operator_new(0x28);
  QHashPrivate::Data<QHashPrivate::MultiNode<char,_QLatin1String>_>::Data(pDVar4,0xf);
  local_1d38.m_size = 0;
  lVar5 = 0;
  local_1d38.d = pDVar4;
  do {
    local_1d39 = local_1d10[lVar5];
    QMultiHash<char,QLatin1String>::emplace<QLatin1String_const&>
              (&local_1d28,&local_1d38,&local_1d39,(QLatin1String *)(local_1d10 + lVar5 + 8));
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x168);
  QVar3.m_size = local_1d38.m_size;
  QVar3.d = local_1d38.d;
  local_1d38.d = (Data *)0x0;
  local_1d38.m_size = 0;
  local_1d28.i.d = sql_builtin.d;
  local_1d28.i.bucket = sql_builtin.m_size;
  sql_builtin = QVar3;
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_1d28);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_1d38);
  local_1d28.i = (piter)ZEXT816(0);
  local_1d10._8_8_ = sql_other.m_size;
  local_1d10._0_8_ = sql_other.d;
  sql_other.d = (Data *)0x0;
  sql_other.m_size = 0;
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)local_1d10);
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_1d28);
  return;
}

Assistant:

void initSQLData() {
    sql_keywords = {{('A'), QLatin1String("ACTION")},
                    {('A'), QLatin1String("ADD")},
                    {('A'), QLatin1String("AFTER")},
                    {('A'), QLatin1String("ALGORITHM")},
                    {('A'), QLatin1String("ALL")},
                    {('A'), QLatin1String("ALTER")},
                    {('A'), QLatin1String("ANALYZE")},
                    {('A'), QLatin1String("ANY")},
                    {('A'), QLatin1String("APPLY")},
                    {('A'), QLatin1String("AS")},
                    {('A'), QLatin1String("ASC")},
                    {('A'), QLatin1String("AUTHORIZATION")},
                    {('A'), QLatin1String("AUTO_INCREMENT")},
                    {('B'), QLatin1String("BACKUP")},
                    {('B'), QLatin1String("BDB")},
                    {('B'), QLatin1String("BEGIN")},
                    {('B'), QLatin1String("BERKELEYDB")},
                    {('B'), QLatin1String("BIGINT")},
                    {('B'), QLatin1String("BINARY")},
                    {('B'), QLatin1String("BIT")},
                    {('B'), QLatin1String("BLOB")},
                    {('B'), QLatin1String("BOOL")},
                    {('B'), QLatin1String("BOOLEAN")},
                    {('B'), QLatin1String("BREAK")},
                    {('B'), QLatin1String("BROWSE")},
                    {('B'), QLatin1String("BTREE")},
                    {('B'), QLatin1String("BULK")},
                    {('B'), QLatin1String("BY")},
                    {('C'), QLatin1String("CALL")},
                    {('C'), QLatin1String("CASCADED")},
                    {('C'), QLatin1String("CASE")},
                    {('C'), QLatin1String("CHAIN")},
                    {('C'), QLatin1String("CHARACTER")},
                    {('S'), QLatin1String("SET")},
                    {('C'), QLatin1String("CHECKPOINT")},
                    {('C'), QLatin1String("CLOSE")},
                    {('C'), QLatin1String("CLUSTERED")},
                    {('C'), QLatin1String("COALESCE")},
                    {('C'), QLatin1String("COLLATE")},
                    {('C'), QLatin1String("COLUMNS")},
                    {('C'), QLatin1String("COMMENT")},
                    {('C'), QLatin1String("COMMITTED")},
                    {('C'), QLatin1String("COMPUTE")},
                    {('C'), QLatin1String("CONNECT")},
                    {('C'), QLatin1String("CONSISTENT")},
                    {('C'), QLatin1String("CONSTRAINT")},
                    {('C'), QLatin1String("CONTAINSTABLE")},
                    {('C'), QLatin1String("CONTINUE")},
                    {('C'), QLatin1String("CONVERT")},
                    {('C'), QLatin1String("CREATE")},
                    {('C'), QLatin1String("CROSS")},
                    {('C'), QLatin1String("CURRENT_DATE")},
                    {('_'), QLatin1String("_TIME")},
                    {('_'), QLatin1String("_TIMESTAMP")},
                    {('_'), QLatin1String("_USER")},
                    {('C'), QLatin1String("CURSOR")},
                    {('C'), QLatin1String("CYCLE")},
                    {('D'), QLatin1String("DATABASES")},
                    {('D'), QLatin1String("DATETIME")},
                    {('D'), QLatin1String("DAY")},
                    {('D'), QLatin1String("DBCC")},
                    {('D'), QLatin1String("DEALLOCATE")},
                    {('D'), QLatin1String("DEC")},
                    {('D'), QLatin1String("DECIMAL")},
                    {('D'), QLatin1String("DECLARE")},
                    {('D'), QLatin1String("DEFAULT")},
                    {('D'), QLatin1String("DEFINER")},
                    {('D'), QLatin1String("DELAYED")},
                    {('D'), QLatin1String("DELETE")},
                    {('D'), QLatin1String("DELIMITERS")},
                    {('D'), QLatin1String("DENY")},
                    {('D'), QLatin1String("DESC")},
                    {('D'), QLatin1String("DESCRIBE")},
                    {('D'), QLatin1String("DETERMINISTIC")},
                    {('D'), QLatin1String("DISABLE")},
                    {('D'), QLatin1String("DISCARD")},
                    {('D'), QLatin1String("DISK")},
                    {('D'), QLatin1String("DISTINCT")},
                    {('D'), QLatin1String("DISTINCTROW")},
                    {('D'), QLatin1String("DISTRIBUTED")},
                    {('D'), QLatin1String("DO")},
                    {('D'), QLatin1String("DOUBLE")},
                    {('D'), QLatin1String("DROP")},
                    {('D'), QLatin1String("DUMMY")},
                    {('D'), QLatin1String("DUMPFILE")},
                    {('D'), QLatin1String("DUPLICATE")},
                    {('E'), QLatin1String("ELSEIF")},
                    {('E'), QLatin1String("ENABLE")},
                    {('E'), QLatin1String("ENCLOSED")},
                    {('E'), QLatin1String("END")},
                    {('E'), QLatin1String("ENGINE")},
                    {('E'), QLatin1String("ENUM")},
                    {('E'), QLatin1String("ERRLVL")},
                    {('E'), QLatin1String("ERRORS")},
                    {('E'), QLatin1String("ESCAPED")},
                    {('E'), QLatin1String("EXCEPT")},
                    {('E'), QLatin1String("EXECUTE")},
                    {('E'), QLatin1String("EXISTS")},
                    {('E'), QLatin1String("EXIT")},
                    {('E'), QLatin1String("EXPLAIN")},
                    {('E'), QLatin1String("EXTENDED")},
                    {('F'), QLatin1String("FETCH")},
                    {('F'), QLatin1String("FIELDS")},
                    {('F'), QLatin1String("FILE")},
                    {('F'), QLatin1String("FILLFACTOR")},
                    {('F'), QLatin1String("FIRST")},
                    {('F'), QLatin1String("FIXED")},
                    {('F'), QLatin1String("FLOAT")},
                    {('F'), QLatin1String("FOLLOWING")},
                    {('F'), QLatin1String("FOR")},
                    {('E'), QLatin1String("EACH")},
                    {('R'), QLatin1String("ROW")},
                    {('F'), QLatin1String("FORCE")},
                    {('F'), QLatin1String("FOREIGN")},
                    {('F'), QLatin1String("FREETEXTTABLE")},
                    {('F'), QLatin1String("FROM")},
                    {('F'), QLatin1String("FULL")},
                    {('F'), QLatin1String("FUNCTION")},
                    {('G'), QLatin1String("GEOMETRYCOLLECTION")},
                    {('G'), QLatin1String("GLOBAL")},
                    {('G'), QLatin1String("GOTO")},
                    {('G'), QLatin1String("GRANT")},
                    {('G'), QLatin1String("GROUP")},
                    {('H'), QLatin1String("HANDLER")},
                    {('H'), QLatin1String("HASH")},
                    {('H'), QLatin1String("HAVING")},
                    {('H'), QLatin1String("HOLDLOCK")},
                    {('H'), QLatin1String("HOUR")},
                    {('I'), QLatin1String("IDENTITY_INSERT")},
                    {('C'), QLatin1String("COL")},
                    {('I'), QLatin1String("IF")},
                    {('I'), QLatin1String("IGNORE")},
                    {('I'), QLatin1String("IMPORT")},
                    {('I'), QLatin1String("INDEX")},
                    {('I'), QLatin1String("INFILE")},
                    {('I'), QLatin1String("INNER")},
                    {('I'), QLatin1String("INNODB")},
                    {('I'), QLatin1String("INOUT")},
                    {('I'), QLatin1String("INSERT")},
                    {('I'), QLatin1String("INT")},
                    {('I'), QLatin1String("INTEGER")},
                    {('I'), QLatin1String("INTERSECT")},
                    {('I'), QLatin1String("INTERVAL")},
                    {('I'), QLatin1String("INTO")},
                    {('I'), QLatin1String("INVOKER")},
                    {('I'), QLatin1String("ISOLATION")},
                    {('I'), QLatin1String("ITERATE")},
                    {('J'), QLatin1String("JOIN")},
                    {('K'), QLatin1String("KEYS")},
                    {('K'), QLatin1String("KILL")},
                    {('L'), QLatin1String("LANGUAGE")},
                    {('L'), QLatin1String("LAST")},
                    {('L'), QLatin1String("LEAVE")},
                    {('L'), QLatin1String("LEFT")},
                    {('L'), QLatin1String("LEVEL")},
                    {('L'), QLatin1String("LIMIT")},
                    {('L'), QLatin1String("LINENO")},
                    {('L'), QLatin1String("LINES")},
                    {('L'), QLatin1String("LINESTRING")},
                    {('L'), QLatin1String("LOAD")},
                    {('L'), QLatin1String("LOCAL")},
                    {('L'), QLatin1String("LOCK")},
                    {('L'), QLatin1String("LONGBLOB")},
                    {('T'), QLatin1String("TEXT")},
                    {('L'), QLatin1String("LOOP")},
                    {('M'), QLatin1String("MATCHED")},
                    {('M'), QLatin1String("MEDIUMBLOB")},
                    {('I'), QLatin1String("INT")},
                    {('T'), QLatin1String("TEXT")},
                    {('M'), QLatin1String("MERGE")},
                    {('M'), QLatin1String("MIDDLEINT")},
                    {('M'), QLatin1String("MINUTE")},
                    {('M'), QLatin1String("MODE")},
                    {('M'), QLatin1String("MODIFIES")},
                    {('M'), QLatin1String("MODIFY")},
                    {('M'), QLatin1String("MONTH")},
                    {('M'), QLatin1String("MULTILINESTRING")},
                    {('P'), QLatin1String("POINT")},
                    {('P'), QLatin1String("POLYGON")},
                    {('N'), QLatin1String("NATIONAL")},
                    {('N'), QLatin1String("NATURAL")},
                    {('N'), QLatin1String("NCHAR")},
                    {('N'), QLatin1String("NEXT")},
                    {('N'), QLatin1String("NO")},
                    {('N'), QLatin1String("NONCLUSTERED")},
                    {('N'), QLatin1String("NULLIF")},
                    {('N'), QLatin1String("NUMERIC")},
                    {('O'), QLatin1String("OFF")},
                    {('O'), QLatin1String("OFFSETS")},
                    {('O'), QLatin1String("ON")},
                    {('O'), QLatin1String("OPENDATASOURCE")},
                    {('Q'), QLatin1String("QUERY")},
                    {('R'), QLatin1String("ROWSET")},
                    {('O'), QLatin1String("OPTIMIZE")},
                    {('O'), QLatin1String("OPTIONALLY")},
                    {('O'), QLatin1String("ORDER")},
                    {('O'), QLatin1String("OUTER")},
                    {('F'), QLatin1String("FILE")},
                    {('O'), QLatin1String("OVER")},
                    {('P'), QLatin1String("PARTIAL")},
                    {('P'), QLatin1String("PARTITION")},
                    {('P'), QLatin1String("PERCENT")},
                    {('P'), QLatin1String("PIVOT")},
                    {('P'), QLatin1String("PLAN")},
                    {('P'), QLatin1String("POINT")},
                    {('P'), QLatin1String("POLYGON")},
                    {('P'), QLatin1String("PRECEDING")},
                    {('P'), QLatin1String("PRECISION")},
                    {('P'), QLatin1String("PREPARE")},
                    {('P'), QLatin1String("PREV")},
                    {('P'), QLatin1String("PRIMARY")},
                    {('P'), QLatin1String("PRINT")},
                    {('P'), QLatin1String("PRIVILEGES")},
                    {('P'), QLatin1String("PROCEDURE")},
                    {('P'), QLatin1String("PUBLIC")},
                    {('P'), QLatin1String("PURGE")},
                    {('Q'), QLatin1String("QUICK")},
                    {('R'), QLatin1String("RAISERROR")},
                    {('R'), QLatin1String("READS")},
                    {('R'), QLatin1String("REAL")},
                    {('R'), QLatin1String("RECONFIGURE")},
                    {('R'), QLatin1String("REFERENCES")},
                    {('R'), QLatin1String("RELEASE")},
                    {('R'), QLatin1String("RENAME")},
                    {('R'), QLatin1String("REPEATABLE")},
                    {('R'), QLatin1String("REPLACE")},
                    {('R'), QLatin1String("REPLICATION")},
                    {('R'), QLatin1String("REQUIRE")},
                    {('R'), QLatin1String("RESIGNAL")},
                    {('R'), QLatin1String("RESTORE")},
                    {('R'), QLatin1String("RESTRICT")},
                    {('R'), QLatin1String("RETURNS")},
                    {('R'), QLatin1String("REVOKE")},
                    {('R'), QLatin1String("RIGHT")},
                    {('R'), QLatin1String("ROLLBACK")},
                    {('R'), QLatin1String("ROUTINE")},
                    {('R'), QLatin1String("ROWCOUNT")},
                    {('G'), QLatin1String("GUIDCOL")},
                    {('R'), QLatin1String("RTREE")},
                    {('R'), QLatin1String("RULE")},
                    {('S'), QLatin1String("SAVEPOINT")},
                    {('S'), QLatin1String("SCHEMA")},
                    {('S'), QLatin1String("SECOND")},
                    {('S'), QLatin1String("SELECT")},
                    {('S'), QLatin1String("SERIALIZABLE")},
                    {('S'), QLatin1String("SESSION_USER")},
                    {('S'), QLatin1String("SETUSER")},
                    {('S'), QLatin1String("SHARE")},
                    {('S'), QLatin1String("SHOW")},
                    {('S'), QLatin1String("SHUTDOWN")},
                    {('S'), QLatin1String("SIMPLE")},
                    {('S'), QLatin1String("SMALLINT")},
                    {('S'), QLatin1String("SNAPSHOT")},
                    {('S'), QLatin1String("SOME")},
                    {('S'), QLatin1String("SONAME")},
                    {('S'), QLatin1String("SQL")},
                    {('S'), QLatin1String("STARTING")},
                    {('S'), QLatin1String("STATISTICS")},
                    {('S'), QLatin1String("STATUS")},
                    {('S'), QLatin1String("STRIPED")},
                    {('S'), QLatin1String("SYSTEM_USER")},
                    {('T'), QLatin1String("TABLES")},
                    {('T'), QLatin1String("TABLESPACE")},
                    {('T'), QLatin1String("TEMPORARY")},
                    {('T'), QLatin1String("TABLE")},
                    {('T'), QLatin1String("TERMINATED")},
                    {('T'), QLatin1String("TEXTSIZE")},
                    {('T'), QLatin1String("THEN")},
                    {('T'), QLatin1String("TIMESTAMP")},
                    {('T'), QLatin1String("TINYBLOB")},
                    {('I'), QLatin1String("INT")},
                    {('T'), QLatin1String("TEXT")},
                    {('T'), QLatin1String("TOP")},
                    {('T'), QLatin1String("TRANSACTIONS")},
                    {('T'), QLatin1String("TRIGGER")},
                    {('T'), QLatin1String("TRUNCATE")},
                    {('T'), QLatin1String("TSEQUAL")},
                    {('T'), QLatin1String("TYPES")},
                    {('U'), QLatin1String("UNBOUNDED")},
                    {('U'), QLatin1String("UNCOMMITTED")},
                    {('U'), QLatin1String("UNDEFINED")},
                    {('U'), QLatin1String("UNION")},
                    {('U'), QLatin1String("UNIQUE")},
                    {('U'), QLatin1String("UNLOCK")},
                    {('U'), QLatin1String("UNPIVOT")},
                    {('U'), QLatin1String("UNSIGNED")},
                    {('U'), QLatin1String("UPDATETEXT")},
                    {('U'), QLatin1String("USAGE")},
                    {('U'), QLatin1String("USE")},
                    {('U'), QLatin1String("USER")},
                    {('U'), QLatin1String("USING")},
                    {('V'), QLatin1String("VALUES")},
                    {('V'), QLatin1String("VARBINARY")},
                    {('C'), QLatin1String("CHAR")},
                    {('C'), QLatin1String("CHARACTER")},
                    {('Y'), QLatin1String("YING")},
                    {('V'), QLatin1String("VIEW")},
                    {('W'), QLatin1String("WAITFOR")},
                    {('W'), QLatin1String("WARNINGS")},
                    {('W'), QLatin1String("WHEN")},
                    {('W'), QLatin1String("WHERE")},
                    {('W'), QLatin1String("WHILE")},
                    {('W'), QLatin1String("WITH")},
                    {('R'), QLatin1String("ROLLUP")},
                    {('I'), QLatin1String("IN")},
                    {('W'), QLatin1String("WORK")},
                    {('W'), QLatin1String("WRITETEXT")},
                    {('Y'), QLatin1String("YEAR")}};

    sql_types = {

    };

    sql_literals = {
        {('A'), QLatin1String("TRUE")},
        {('F'), QLatin1String("FALSE")},
        {('N'), QLatin1String("NULL")},
    };

    sql_builtin = {
        {('A'), QLatin1String("AVG")},   {('C'), QLatin1String("COUNT")},
        {('F'), QLatin1String("FIRST")}, {('F'), QLatin1String("FORMAT")},
        {('L'), QLatin1String("LAST")},  {('L'), QLatin1String("LCASE")},
        {('L'), QLatin1String("LEN")},   {('M'), QLatin1String("MAX")},
        {('M'), QLatin1String("MID")},   {('M'), QLatin1String("MIN")},
        {('M'), QLatin1String("MOD")},   {('N'), QLatin1String("NOW")},
        {('R'), QLatin1String("ROUND")}, {('S'), QLatin1String("SUM")},
        {('U'), QLatin1String("UCASE")}};

    sql_other = {

    };
}